

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O3

bool __thiscall
binlog::PrettyPrinter::printStruct
          (PrettyPrinter *this,OstreamBuffer *out,StructBegin sb,Range *input)

{
  nanoseconds sinceEpoch;
  bool bVar1;
  int iVar2;
  uint uVar3;
  int64_t *piVar4;
  undefined1 *__n;
  ulong uVar5;
  int64_t v;
  char *pcVar6;
  undefined1 *__buf;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (sb.name._len == 0x25) {
    iVar2 = bcmp(sb.name._ptr,"std::chrono::system_clock::time_point",0x25);
    if (((iVar2 == 0) && (sb.tag._len == 5)) &&
       (sb.tag._ptr[4] == 'l' && *(int *)sb.tag._ptr == 0x27736e60)) {
      if (this->_clockSync != (ClockSync *)0x0) {
        local_48 = (undefined1  [16])0x0;
        local_58 = (undefined1  [16])0x0;
        local_68 = (undefined1  [16])0x0;
        local_78 = (undefined1  [16])0x0;
        Range::throw_if_overflow(input,8);
        sinceEpoch.__r = *(rep *)input->_begin;
        input->_begin = (char *)((long)input->_begin + 8);
        if (this->_useLocaltime == true) {
          nsSinceEpochToBrokenDownTimeUTC
                    ((nanoseconds)((long)this->_clockSync->tzOffset * 1000000000 + sinceEpoch.__r),
                     (BrokenDownTime *)local_78);
          iVar2 = this->_clockSync->tzOffset;
          pcVar6 = (this->_clockSync->tzName)._M_dataplus._M_p;
        }
        else {
          nsSinceEpochToBrokenDownTimeUTC(sinceEpoch,(BrokenDownTime *)local_78);
          pcVar6 = "UTC";
          iVar2 = 0;
        }
        printTime(this,out,(BrokenDownTime *)local_78,iVar2,pcVar6);
        return true;
      }
      return false;
    }
LAB_00111aa3:
    auVar10[0] = -(sb.name._ptr[10] == 'o');
    auVar10[1] = -(sb.name._ptr[0xb] == ':');
    auVar10[2] = -(sb.name._ptr[0xc] == ':');
    auVar10[3] = -(sb.name._ptr[0xd] == 'd');
    auVar10[4] = -(sb.name._ptr[0xe] == 'u');
    auVar10[5] = -(sb.name._ptr[0xf] == 'r');
    auVar10[6] = -(sb.name._ptr[0x10] == 'a');
    auVar10[7] = -(sb.name._ptr[0x11] == 't');
    auVar10[8] = -(sb.name._ptr[0x12] == 'i');
    auVar10[9] = -(sb.name._ptr[0x13] == 'o');
    auVar10[10] = -(sb.name._ptr[0x14] == 'n');
    auVar10[0xb] = -(sb.name._ptr[0x15] == '<');
    auVar10[0xc] = -(sb.name._ptr[0x16] == 'R');
    auVar10[0xd] = -(sb.name._ptr[0x17] == 'e');
    auVar10[0xe] = -(sb.name._ptr[0x18] == 'p');
    auVar10[0xf] = -(sb.name._ptr[0x19] == ',');
    auVar7[0] = -(*sb.name._ptr == 's');
    auVar7[1] = -(sb.name._ptr[1] == 't');
    auVar7[2] = -(sb.name._ptr[2] == 'd');
    auVar7[3] = -(sb.name._ptr[3] == ':');
    auVar7[4] = -(sb.name._ptr[4] == ':');
    auVar7[5] = -(sb.name._ptr[5] == 'c');
    auVar7[6] = -(sb.name._ptr[6] == 'h');
    auVar7[7] = -(sb.name._ptr[7] == 'r');
    auVar7[8] = -(sb.name._ptr[8] == 'o');
    auVar7[9] = -(sb.name._ptr[9] == 'n');
    auVar7[10] = -(sb.name._ptr[10] == 'o');
    auVar7[0xb] = -(sb.name._ptr[0xb] == ':');
    auVar7[0xc] = -(sb.name._ptr[0xc] == ':');
    auVar7[0xd] = -(sb.name._ptr[0xd] == 'd');
    auVar7[0xe] = -(sb.name._ptr[0xe] == 'u');
    auVar7[0xf] = -(sb.name._ptr[0xf] == 'r');
    auVar7 = auVar7 & auVar10;
    if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
      if (*(short *)(sb.name._ptr + (sb.name._len - 2)) == 0x3e6f &&
          *(long *)(sb.name._ptr + (sb.name._len - 10)) == 0x6e616e3a3a647473) {
        pcVar6 = "ns";
      }
      else if (*(long *)(sb.name._ptr + (sb.name._len - 8)) == 0x3e6f7263696d3a3a &&
               *(long *)(sb.name._ptr + (sb.name._len - 0xb)) == 0x63696d3a3a647473) {
        pcVar6 = "us";
      }
      else if (*(long *)(sb.name._ptr + (sb.name._len - 8)) == 0x3e696c6c696d3a3a &&
               *(long *)(sb.name._ptr + (sb.name._len - 0xb)) == 0x6c696d3a3a647473) {
        pcVar6 = "ms";
      }
      else if (*(long *)(sb.name._ptr + (sb.name._len - 8)) == 0x3e3e313c6f697461 &&
               *(long *)(sb.name._ptr + (sb.name._len - 0xe)) == 0x7461723a3a647473) {
        pcVar6 = "s";
      }
      else if (*(long *)(sb.name._ptr + (sb.name._len - 8)) == 0x3e3e30363c6f6974 &&
               *(long *)(sb.name._ptr + (sb.name._len - 0xf)) == 0x7461723a3a647473) {
        pcVar6 = "m";
      }
      else {
        pcVar6 = sb.name._ptr + (sb.name._len - 0x11);
        auVar8[0] = -(*pcVar6 == 's');
        auVar8[1] = -(pcVar6[1] == 't');
        auVar8[2] = -(pcVar6[2] == 'd');
        auVar8[3] = -(pcVar6[3] == ':');
        auVar8[4] = -(pcVar6[4] == ':');
        auVar8[5] = -(pcVar6[5] == 'r');
        auVar8[6] = -(pcVar6[6] == 'a');
        auVar8[7] = -(pcVar6[7] == 't');
        auVar8[8] = -(pcVar6[8] == 'i');
        auVar8[9] = -(pcVar6[9] == 'o');
        auVar8[10] = -(pcVar6[10] == '<');
        auVar8[0xb] = -(pcVar6[0xb] == '3');
        auVar8[0xc] = -(pcVar6[0xc] == '6');
        auVar8[0xd] = -(pcVar6[0xd] == '0');
        auVar8[0xe] = -(pcVar6[0xe] == '0');
        auVar8[0xf] = -(pcVar6[0xf] == '>');
        auVar11[0] = -(sb.name._ptr[sb.name._len - 1] == '>');
        auVar11[1] = 0xff;
        auVar11[2] = 0xff;
        auVar11[3] = 0xff;
        auVar11[4] = 0xff;
        auVar11[5] = 0xff;
        auVar11[6] = 0xff;
        auVar11[7] = 0xff;
        auVar11[8] = 0xff;
        auVar11[9] = 0xff;
        auVar11[10] = 0xff;
        auVar11[0xb] = 0xff;
        auVar11[0xc] = 0xff;
        auVar11[0xd] = 0xff;
        auVar11[0xe] = 0xff;
        auVar11[0xf] = 0xff;
        auVar11 = auVar11 & auVar8;
        if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00111c82;
        pcVar6 = "h";
      }
      if (sb.tag._len == 8) {
        __n = (undefined1 *)0x6c27746e756f6360;
        if (*(long *)sb.tag._ptr == 0x6c27746e756f6360) {
          Range::throw_if_overflow(input,8);
          v = *(int64_t *)input->_begin;
          piVar4 = (int64_t *)((long)input->_begin + 8);
        }
        else {
          __n = (undefined1 *)0x6927746e756f6360;
          if (*(long *)sb.tag._ptr != 0x6927746e756f6360) goto LAB_00111c82;
          Range::throw_if_overflow(input,4);
          v = (int64_t)*(int *)input->_begin;
          piVar4 = (int64_t *)((long)input->_begin + 4);
        }
        input->_begin = (char *)piVar4;
        detail::OstreamBuffer::writeSigned(out,v);
        __buf = (undefined1 *)strlen(pcVar6);
        goto LAB_00111e0d;
      }
    }
LAB_00111c82:
    if (sb.name._len == 0xf) goto LAB_00111cf4;
    if (sb.name._len == 0x20) {
      uVar3 = bcmp(sb.name._ptr,"std::filesystem::directory_entry",0x20);
      __n = (undefined1 *)(ulong)uVar3;
      if (uVar3 != 0) {
        return false;
      }
      if (sb.tag._len != 0x24) {
        return false;
      }
      iVar2 = bcmp(sb.tag._ptr,"`path\'{std::filesystem::path`str\'[c}",0x24);
      if (iVar2 != 0) {
        return false;
      }
    }
    else {
      if (sb.name._len != 0x15) {
        return false;
      }
      auVar12[0] = -(sb.name._ptr[5] == 'f');
      auVar12[1] = -(sb.name._ptr[6] == 'i');
      auVar12[2] = -(sb.name._ptr[7] == 'l');
      auVar12[3] = -(sb.name._ptr[8] == 'e');
      auVar12[4] = -(sb.name._ptr[9] == 's');
      auVar12[5] = -(sb.name._ptr[10] == 'y');
      auVar12[6] = -(sb.name._ptr[0xb] == 's');
      auVar12[7] = -(sb.name._ptr[0xc] == 't');
      auVar12[8] = -(sb.name._ptr[0xd] == 'e');
      auVar12[9] = -(sb.name._ptr[0xe] == 'm');
      auVar12[10] = -(sb.name._ptr[0xf] == ':');
      auVar12[0xb] = -(sb.name._ptr[0x10] == ':');
      auVar12[0xc] = -(sb.name._ptr[0x11] == 'p');
      auVar12[0xd] = -(sb.name._ptr[0x12] == 'a');
      auVar12[0xe] = -(sb.name._ptr[0x13] == 't');
      auVar12[0xf] = -(sb.name._ptr[0x14] == 'h');
      auVar9[0] = -(*sb.name._ptr == 's');
      auVar9[1] = -(sb.name._ptr[1] == 't');
      auVar9[2] = -(sb.name._ptr[2] == 'd');
      auVar9[3] = -(sb.name._ptr[3] == ':');
      auVar9[4] = -(sb.name._ptr[4] == ':');
      auVar9[5] = -(sb.name._ptr[5] == 'f');
      auVar9[6] = -(sb.name._ptr[6] == 'i');
      auVar9[7] = -(sb.name._ptr[7] == 'l');
      auVar9[8] = -(sb.name._ptr[8] == 'e');
      auVar9[9] = -(sb.name._ptr[9] == 's');
      auVar9[10] = -(sb.name._ptr[10] == 'y');
      auVar9[0xb] = -(sb.name._ptr[0xb] == 's');
      auVar9[0xc] = -(sb.name._ptr[0xc] == 't');
      auVar9[0xd] = -(sb.name._ptr[0xd] == 'e');
      auVar9[0xe] = -(sb.name._ptr[0xe] == 'm');
      auVar9[0xf] = -(sb.name._ptr[0xf] == ':');
      auVar9 = auVar9 & auVar12;
      if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) != 0xffff) {
        return false;
      }
      if (sb.tag._len != 7) {
        return false;
      }
      __n = (undefined1 *)(ulong)(*(uint *)sb.tag._ptr ^ 0x72747360);
      if (*(int *)(sb.tag._ptr + 3) != 0x635b2772 || (*(uint *)sb.tag._ptr ^ 0x72747360) != 0) {
        return false;
      }
    }
  }
  else {
    if (sb.name._len != 0xf) {
      if (0x19 < sb.name._len) goto LAB_00111aa3;
      goto LAB_00111c82;
    }
    if (((*(long *)(sb.name._ptr + 7) == 0x737365726464613a &&
          *(long *)sb.name._ptr == 0x3a3a676f6c6e6962) && (sb.tag._len == 8)) &&
       (*(long *)sb.tag._ptr == 0x4c2765756c617660)) {
      Range::throw_if_overflow(input,8);
      uVar5 = *(ulong *)input->_begin;
      input->_begin = (char *)((long)input->_begin + 8);
      __n = local_68 + 3;
      if (uVar5 == 0) {
        __n = local_68 + 2;
        local_68[2] = 0x30;
      }
      else {
        do {
          __n[-1] = "0123456789ABCDEF"[(uint)uVar5 & 0xf];
          __n = __n + -1;
          bVar1 = 0xf < uVar5;
          uVar5 = uVar5 >> 4;
        } while (bVar1);
      }
      local_68._8_8_ = __n;
      detail::OstreamBuffer::write(out,0x115b81,(void *)0x2,(size_t)__n);
      __buf = local_68 + 3 + -local_68._8_8_;
      pcVar6 = (char *)local_68._8_8_;
      goto LAB_00111e0d;
    }
LAB_00111cf4:
    iVar2 = bcmp(sb.name._ptr,"std::error_code",sb.name._len);
    if (iVar2 != 0) {
      return false;
    }
    if (sb.tag._len != 0xb) {
      return false;
    }
    __n = (undefined1 *)(*(ulong *)sb.tag._ptr ^ 0x6567617373656d60);
    if (*(long *)(sb.tag._ptr + 3) != 0x635b276567617373 || __n != (undefined1 *)0x0) {
      return false;
    }
  }
  Range::throw_if_overflow(input,4);
  __buf = (undefined1 *)(ulong)*(uint *)input->_begin;
  input->_begin = (char *)((long)input->_begin + 4);
  Range::throw_if_overflow(input,(size_t)__buf);
  pcVar6 = input->_begin;
  input->_begin = pcVar6 + (long)__buf;
LAB_00111e0d:
  detail::OstreamBuffer::write(out,(int)pcVar6,__buf,(size_t)__n);
  return true;
}

Assistant:

bool PrettyPrinter::printStruct(detail::OstreamBuffer& out, mserialize::Visitor::StructBegin sb, Range& input) const
{
  if (sb.name == "binlog::address" && sb.tag == "`value'L")
  {
    const std::uint64_t value = input.read<std::uint64_t>();
    mserialize::detail::IntegerToHex tohex;
    tohex.visit(value);
    out << "0x" << tohex.value();
    return true;
  }

  if (sb.name == "std::chrono::system_clock::time_point" && sb.tag == "`ns'l")
  {
    if (_clockSync == nullptr) { return false; }

    BrokenDownTime bdt{};
    const auto sinceEpoch = std::chrono::nanoseconds{input.read<std::int64_t>()};

    if (_useLocaltime)
    {
      const std::chrono::nanoseconds sinceEpochTz = sinceEpoch + std::chrono::seconds{_clockSync->tzOffset};
      nsSinceEpochToBrokenDownTimeUTC(sinceEpochTz, bdt);
      printTime(out, bdt, _clockSync->tzOffset, _clockSync->tzName.data());
    }
    else
    {
      nsSinceEpochToBrokenDownTimeUTC(sinceEpoch, bdt);
      printTime(out, bdt, 0, "UTC");
    }
    return true;
  }

  if (sb.name.starts_with("std::chrono::duration<Rep,"))
  {
    const char* suffix =
      sb.name.ends_with("std::nano>") ? "ns" :
      sb.name.ends_with("std::micro>") ? "us" :
      sb.name.ends_with("std::milli>") ? "ms" :
      sb.name.ends_with("std::ratio<1>>") ? "s" :
      sb.name.ends_with("std::ratio<60>>") ? "m" :
      sb.name.ends_with("std::ratio<3600>>") ? "h" :
      nullptr;
    if (suffix != nullptr)
    {
      if (sb.tag == "`count'l")
      {
        const std::int64_t count = input.read<std::int64_t>();
        out << count << suffix;
        return true;
      }
      if (sb.tag == "`count'i") // on MSVC, for minutes and hours
      {
        const std::int32_t count = input.read<std::int32_t>();
        out << count << suffix;
        return true;
      }
    }
  }

  if ((sb.name == "std::filesystem::path" && sb.tag == "`str'[c")
  || (sb.name == "std::filesystem::directory_entry" && sb.tag == "`path'{std::filesystem::path`str'[c}")
  || (sb.name == "std::error_code" && sb.tag == "`message'[c")
  ) {
    const std::uint32_t size = input.read<std::uint32_t>();
    out.write(input.view(size), size);
    return true;
  }

  return false;
}